

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

void __thiscall
wasm::WATParser::ParseDeclsCtx::ParseDeclsCtx(ParseDeclsCtx *this,Lexer *in,Module *wasm)

{
  Lexer::Lexer(&this->in,in);
  this->wasm = wasm;
  memset(&this->recTypeDefs,0,0x120);
  (this->implicitElemIndices)._M_h._M_buckets = &(this->implicitElemIndices)._M_h._M_single_bucket;
  (this->implicitElemIndices)._M_h._M_bucket_count = 1;
  (this->implicitElemIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->implicitElemIndices)._M_h._M_element_count = 0;
  (this->implicitElemIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->implicitElemIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->implicitElemIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->funcCounter = 0;
  this->tableCounter = 0;
  this->memoryCounter = 0;
  this->globalCounter = 0;
  *(undefined8 *)((long)&this->globalCounter + 1) = 0;
  *(undefined8 *)((long)&this->dataCounter + 1) = 0;
  return;
}

Assistant:

ParseDeclsCtx(Lexer& in, Module& wasm) : in(in), wasm(wasm) {}